

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Obj_t * Aig_ManDupDfs_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  
  pAVar4 = (Aig_Obj_t *)(pObj->field_5).pData;
  if (pAVar4 == (Aig_Obj_t *)0x0) {
    if ((p->pEquivs == (Aig_Obj_t **)0x0) ||
       (pAVar4 = p->pEquivs[pObj->Id], pAVar4 == (Aig_Obj_t *)0x0)) {
      pAVar3 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar3 = Aig_ManDupDfs_rec(pNew,p,pAVar4);
    }
    Aig_ManDupDfs_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    if ((*(uint *)&pObj->field_0x18 & 7) == 4) {
      pAVar4 = Aig_ObjChild0Copy(pObj);
    }
    else {
      Aig_ManDupDfs_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      pAVar4 = Aig_ObjChild0Copy(pObj);
      p1 = Aig_ObjChild1Copy(pObj);
      pAVar4 = Aig_Oper(pNew,pAVar4,p1,*(Aig_Type_t *)&pObj->field_0x18 & AIG_OBJ_VOID);
      if (pAVar3 != (Aig_Obj_t *)0x0) {
        iVar1 = ((Aig_Obj_t *)((ulong)pAVar3 & 0xfffffffffffffffe))->Id;
        iVar2 = ((Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe))->Id;
        if (iVar2 <= iVar1) {
          __assert_fail("Aig_Regular(pEquivNew)->Id < Aig_Regular(pObjNew)->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                        ,0x21f,"Aig_Obj_t *Aig_ManDupDfs_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)"
                       );
        }
        if (pNew->pEquivs != (Aig_Obj_t **)0x0) {
          pNew->pEquivs[iVar2] = (Aig_Obj_t *)((ulong)pAVar3 & 0xfffffffffffffffe);
        }
        if (pNew->pReprs != (Aig_Obj_t **)0x0) {
          pNew->pReprs[iVar1] = (Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
      }
    }
    (pObj->field_5).pData = pAVar4;
  }
  return pAVar4;
}

Assistant:

Aig_Obj_t * Aig_ManDupDfs_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew, * pEquivNew = NULL;
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    if ( p->pEquivs && Aig_ObjEquiv(p, pObj) )
        pEquivNew = Aig_ManDupDfs_rec( pNew, p, Aig_ObjEquiv(p, pObj) );
    Aig_ManDupDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );
    if ( Aig_ObjIsBuf(pObj) )
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjChild0Copy(pObj));
    Aig_ManDupDfs_rec( pNew, p, Aig_ObjFanin1(pObj) );
    pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
    if ( pEquivNew )
    {
        assert( Aig_Regular(pEquivNew)->Id < Aig_Regular(pObjNew)->Id );
        if ( pNew->pEquivs )
            pNew->pEquivs[Aig_Regular(pObjNew)->Id] = Aig_Regular(pEquivNew);        
        if ( pNew->pReprs )
            pNew->pReprs[Aig_Regular(pEquivNew)->Id] = Aig_Regular(pObjNew);
    }
    return (Aig_Obj_t *)(pObj->pData = pObjNew);
}